

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setAttribute(QWidget *this,WidgetAttribute attribute,bool on)

{
  ushort *puVar1;
  QWidgetPrivate *this_00;
  bool bVar2;
  char cVar3;
  QWidgetPrivate *pQVar4;
  uint *puVar5;
  QWidgetRepaintManager *this_01;
  ulong uVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  undefined8 uVar9;
  long lVar10;
  QWidgetData *pQVar11;
  WidgetAttribute WVar12;
  uint uVar13;
  uint uVar14;
  Type TVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar4 = this_00;
  if (attribute == WA_ContentsMarginsRespectsSafeArea) {
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      QWidgetPrivate::createTLExtra(this_00);
      puVar1 = (ushort *)
               ((long)(((this_00->extra)._M_t.
                        super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                        super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                        super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                      super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0xe0);
      *puVar1 = *puVar1 | 0x800;
      pQVar4 = *(QWidgetPrivate **)&this->field_0x8;
    }
LAB_002f5a39:
    puVar5 = pQVar4->high_attributes + (attribute - WA_ForceDisabled >> 5);
    bVar2 = false;
    WVar12 = attribute & (WA_WState_Hidden|WA_WState_Visible);
  }
  else {
    if (0x1f < (int)attribute) goto LAB_002f5a39;
    puVar5 = &this->data->widget_attributes;
    bVar2 = true;
    WVar12 = attribute;
  }
  if ((((*puVar5 >> (WVar12 & (WA_WState_Hidden|WA_WState_Visible)) & 1) != 0) == on) ||
     (((attribute == WA_NativeWindow && ((this_00->field_0x252 & 0x80) == 0)) &&
      (cVar3 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))(), cVar3 == '\0')
      ))) goto switchD_002f5af5_caseD_51;
  pQVar11 = this->data;
  uVar14 = 1 << ((byte)attribute & 0x1f);
  if (bVar2) {
    if (on) {
      pQVar11->widget_attributes = pQVar11->widget_attributes | uVar14;
    }
    else {
      pQVar11->widget_attributes = pQVar11->widget_attributes & ~uVar14;
    }
  }
  else {
    uVar13 = attribute - WA_ForceDisabled >> 5;
    if (on) {
      this_00->high_attributes[uVar13] = this_00->high_attributes[uVar13] | uVar14;
    }
    else {
      this_00->high_attributes[uVar13] = this_00->high_attributes[uVar13] & ~uVar14;
    }
  }
  if ((int)attribute < 0x46) {
    switch(attribute) {
    case WA_MouseTracking:
      TVar15 = MouseTrackingChange;
      goto LAB_002f5ea4;
    case WA_MouseTracking|WA_UnderMouse:
    case WA_OpaquePaintEvent|WA_MouseTracking:
    case WA_LaidOut:
    case WA_UpdatesDisabled:
    case WA_Mapped:
    case WA_PaintOnScreen|WA_OpaquePaintEvent:
    case WA_PaintOnScreen|WA_StaticContents:
      break;
    case WA_OpaquePaintEvent:
    case WA_NoSystemBackground:
      goto switchD_002f5b39_caseD_4;
    case WA_StaticContents:
      this_01 = QWidgetPrivate::maybeRepaintManager(this_00);
      if (this_01 != (QWidgetRepaintManager *)0x0) {
        if (on) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            QWidgetRepaintManager::addStaticWidget((QWidgetRepaintManager *)this_01,this);
            return;
          }
        }
        else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QWidgetRepaintManager::removeStaticWidget((QWidgetRepaintManager *)this_01,this);
          return;
        }
        goto LAB_002f5fcb;
      }
      break;
    case WA_PaintOnScreen:
      QWidgetPrivate::updateIsOpaque(this_00);
      goto switchD_002f5b39_caseD_4;
    case WA_InputMethodEnabled:
      pQVar7 = (QWidget *)QGuiApplication::focusObject();
      if (pQVar7 == this) {
        if (!on) {
          QGuiApplication::inputMethod();
          QInputMethod::commit();
        }
        goto LAB_002f5c46;
      }
      break;
    default:
      if (attribute == WA_NoChildEventsFromChildren) {
        uVar13 = (uint)!on << 5;
        uVar14 = *(uint *)&this_00->field_0x30 & 0xffffffdf;
      }
      else {
        if (attribute != WA_NoChildEventsForParent) break;
        uVar13 = (uint)!on << 4;
        uVar14 = *(uint *)&this_00->field_0x30 & 0xffffffef;
      }
      *(uint *)&this_00->field_0x30 = uVar14 | uVar13;
    }
    goto switchD_002f5af5_caseD_51;
  }
  switch(attribute) {
  case WA_AcceptDrops:
    if (on) {
      lVar10 = *(long *)&this->field_0x8;
LAB_002f5e75:
      if ((*(byte *)(lVar10 + 0x245) & 0x80) == 0) goto LAB_002f5e7e;
    }
    else {
      if ((((pQVar11->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
         (lVar10 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar10 != 0)) {
        lVar10 = *(long *)(lVar10 + 8);
        goto LAB_002f5e75;
      }
LAB_002f5e7e:
      setAttribute(this,WA_DropSiteRegistered,on);
    }
    TVar15 = AcceptDropsChange;
LAB_002f5ea4:
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,TVar15);
    QCoreApplication::sendEvent(&this->super_QObject,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
    break;
  case WA_DropSiteRegistered:
    uVar6 = *(ulong *)&this_00->field_0x28;
    if (uVar6 != 0) {
      uVar16 = 0;
      do {
        pQVar7 = *(QWidget **)(*(long *)&this_00->field_0x20 + uVar16 * 8);
        if (((pQVar7 != (QWidget *)0x0) &&
            ((*(byte *)(*(long *)&pQVar7->field_0x8 + 0x30) & 1) != 0)) &&
           ((((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
            ((uVar14 = *(uint *)(*(long *)&pQVar7->field_0x8 + 0x244), (uVar14 >> 0xe & 1) == 0 &&
             ((short)uVar14 < 0 != on)))))) {
          setAttribute(pQVar7,WA_DropSiteRegistered,on);
          uVar6 = *(ulong *)&this_00->field_0x28;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar6);
    }
    break;
  case WA_WindowPropagation:
    QWidgetPrivate::resolvePalette(this_00);
    QWidgetPrivate::resolveFont(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetPrivate::resolveLocale(this_00);
      return;
    }
    goto LAB_002f5fcb;
  case WA_NoX11EventCompression:
  case WA_TintedBackground:
  case WA_X11OpenGLOverlay:
  case WA_AlwaysShowToolTips:
  case WA_MacOpaqueSizeGrip:
  case WA_SetStyle:
  case WA_SetLocale:
  case WA_MacShowFocusRect:
  case WA_MacNormalSize:
  case WA_MacSmallSize:
  case WA_MacMiniSize:
  case WA_LayoutUsesWidgetRect:
  case WA_StyledBackground:
  case WA_LayoutUsesWidgetRect|WA_MouseTracking:
  case WA_CanHostQMdiSubWindowTitleBar:
  case WA_MacAlwaysShowToolWindow:
  case WA_StyleSheet:
  case WA_ShowWithoutActivating:
  case WA_X11BypassTransientForHint:
  case WA_DontCreateNativeAncestors:
  case WA_NativeWindow|WA_MouseTracking:
  case WA_X11NetWmWindowTypeDND|WA_UnderMouse:
  case WA_SetWindowModality:
  case WA_WState_WindowOpacitySet:
    break;
  case WA_NativeWindow:
    QWidgetPrivate::createTLExtra(this_00);
    if (on) {
      QWidgetPrivate::createTLSysExtra(this_00);
      pQVar7 = QWidgetPrivate::effectiveFocusWidget(this_00);
      if (((this->data->winid == 0) &&
          (pQVar8 = (QWidget *)QGuiApplication::focusObject(), pQVar8 == this)) &&
         ((pQVar7->data->widget_attributes & 0x4000) != 0)) {
        QGuiApplication::inputMethod();
        QInputMethod::commit();
        uVar9 = QGuiApplication::inputMethod();
        QInputMethod::update(uVar9,1);
      }
    }
    else {
      pQVar7 = QWidgetPrivate::effectiveFocusWidget(this_00);
    }
    cVar3 = QCoreApplication::testAttribute(AA_DontCreateNativeWidgetSiblings);
    if ((cVar3 == '\0') && (lVar10 = *(long *)(*(long *)&this->field_0x8 + 0x10), lVar10 != 0)) {
      QWidgetPrivate::enforceNativeChildren(*(QWidgetPrivate **)(lVar10 + 8));
    }
    pQVar11 = this->data;
    if (((on) && (pQVar11->winid == 0)) &&
       ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0)) {
      QWidgetPrivate::createWinId(this_00);
      pQVar11 = this->data;
    }
    if ((((pQVar11->widget_attributes & 1) == 0) && ((pQVar7->data->widget_attributes & 1) == 0)) &&
       ((pQVar8 = (QWidget *)QGuiApplication::focusObject(), pQVar8 == this &&
        ((pQVar7->data->widget_attributes & 0x4000) != 0)))) {
LAB_002f5c46:
      uVar9 = QGuiApplication::inputMethod();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QInputMethod::update(uVar9,1);
        return;
      }
      goto LAB_002f5fcb;
    }
    break;
  case WA_DontShowOnScreen:
    if ((on) && ((pQVar11->widget_attributes & 0x8000) != 0)) {
      QWidgetPrivate::hide_sys(this_00);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QWidgetPrivate::show_sys(this_00);
        return;
      }
      goto LAB_002f5fcb;
    }
    break;
  case WA_X11NetWmWindowTypeDesktop:
  case WA_X11NetWmWindowTypeDock:
  case WA_X11NetWmWindowTypeToolBar:
  case WA_X11NetWmWindowTypeMenu:
  case WA_X11NetWmWindowTypeUtility:
  case WA_X11NetWmWindowTypeSplash:
  case WA_X11NetWmWindowTypeDialog:
  case WA_X11NetWmWindowTypeDropDownMenu:
  case WA_X11NetWmWindowTypePopupMenu:
  case WA_X11NetWmWindowTypeToolTip:
  case WA_X11NetWmWindowTypeNotification:
  case WA_X11NetWmWindowTypeCombo:
  case WA_X11NetWmWindowTypeDND:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetPrivate::setNetWmWindowTypes(this_00,false);
      return;
    }
    goto LAB_002f5fcb;
  case WA_TranslucentBackground:
    if (on) {
      setAttribute(this,WA_NoSystemBackground,true);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QWidgetPrivate::updateIsTranslucent(this_00);
      return;
    }
    goto LAB_002f5fcb;
  default:
    if (attribute == WA_ShowModal) {
      uVar14 = *(uint *)&pQVar11->field_0x10;
      if (on) {
        if ((uVar14 & 0x30000) == 0) {
          uVar14 = uVar14 | 0x20000;
          goto LAB_002f5f6c;
        }
      }
      else {
        uVar14 = uVar14 & 0xfffcffff;
LAB_002f5f6c:
        *(uint *)&pQVar11->field_0x10 = uVar14;
      }
      if ((*(byte *)(*(long *)&this->field_0x8 + 0x243) & 0x10) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          QWidgetPrivate::setModal_sys(this_00);
          return;
        }
        goto LAB_002f5fcb;
      }
    }
    else if (attribute == WA_TabletTracking) {
      TVar15 = TabletTrackingChange;
      goto LAB_002f5ea4;
    }
  }
switchD_002f5af5_caseD_51:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_002f5fcb:
  __stack_chk_fail();
switchD_002f5b39_caseD_4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    QWidgetPrivate::updateIsOpaque(this_00);
    return;
  }
  goto LAB_002f5fcb;
}

Assistant:

void QWidget::setAttribute(Qt::WidgetAttribute attribute, bool on)
{
    Q_D(QWidget);

    if (attribute == Qt::WA_ContentsMarginsRespectsSafeArea) {
        if (isWindow()) {
            auto *topExtra = d->topData();
            topExtra->explicitContentsMarginsRespectsSafeArea = true;
        }
    }

    if (testAttribute(attribute) == on)
        return;

    static_assert(sizeof(d->high_attributes)*8 >= (Qt::WA_AttributeCount - sizeof(uint)*8),
                      "QWidget::setAttribute(WidgetAttribute, bool): "
                      "QWidgetPrivate::high_attributes[] too small to contain all attributes in WidgetAttribute");
#ifdef Q_OS_WIN
    // ### Don't use PaintOnScreen+paintEngine() to do native painting in some future release
    if (attribute == Qt::WA_PaintOnScreen && on && windowType() != Qt::Desktop && !inherits("QGLWidget")) {
        // see ::paintEngine for details
        paintEngine();
        if (d->noPaintOnScreen)
            return;
    }
#endif

    // Don't set WA_NativeWindow on platforms that don't support it -- except for QGLWidget, which depends on it
    if (attribute == Qt::WA_NativeWindow && !d->mustHaveWindowHandle) {
        QPlatformIntegration *platformIntegration = QGuiApplicationPrivate::platformIntegration();
        if (!platformIntegration->hasCapability(QPlatformIntegration::NativeWidgets))
            return;
    }

    setAttribute_internal(attribute, on, data, d);

    switch (attribute) {

#if QT_CONFIG(draganddrop)
    case Qt::WA_AcceptDrops:  {
        if (on && !testAttribute(Qt::WA_DropSiteRegistered))
            setAttribute(Qt::WA_DropSiteRegistered, true);
        else if (!on && (isWindow() || !parentWidget() || !parentWidget()->testAttribute(Qt::WA_DropSiteRegistered)))
            setAttribute(Qt::WA_DropSiteRegistered, false);
        QEvent e(QEvent::AcceptDropsChange);
        QCoreApplication::sendEvent(this, &e);
        break;
    }
    case Qt::WA_DropSiteRegistered:  {
        for (int i = 0; i < d->children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_AcceptDrops) && w->testAttribute(Qt::WA_DropSiteRegistered) != on)
                w->setAttribute(Qt::WA_DropSiteRegistered, on);
        }
        break;
    }
#endif

    case Qt::WA_NoChildEventsForParent:
        d->sendChildEvents = !on;
        break;
    case Qt::WA_NoChildEventsFromChildren:
        d->receiveChildEvents = !on;
        break;
    case Qt::WA_MacNormalSize:
    case Qt::WA_MacSmallSize:
    case Qt::WA_MacMiniSize:
#ifdef Q_OS_MAC
        {
            // We can only have one of these set at a time
            const Qt::WidgetAttribute MacSizes[] = { Qt::WA_MacNormalSize, Qt::WA_MacSmallSize,
                                                     Qt::WA_MacMiniSize };
            for (int i = 0; i < 3; ++i) {
                if (MacSizes[i] != attribute)
                    setAttribute_internal(MacSizes[i], false, data, d);
            }
            d->macUpdateSizeAttribute();
        }
#endif
        break;
    case Qt::WA_ShowModal:
        if (!on) {
            // reset modality type to NonModal when clearing WA_ShowModal
            data->window_modality = Qt::NonModal;
        } else if (data->window_modality == Qt::NonModal) {
            // If modality hasn't been set prior to setting WA_ShowModal, use
            // ApplicationModal.
            data->window_modality = Qt::ApplicationModal;
            // Some window managers do not allow us to enter modality after the
            // window is visible.The window must be hidden before changing the
            // windowModality property and then reshown.
        }
        if (testAttribute(Qt::WA_WState_Created)) {
            // don't call setModal_sys() before create()
            d->setModal_sys();
        }
        break;
    case Qt::WA_MouseTracking: {
        QEvent e(QEvent::MouseTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_TabletTracking: {
        QEvent e(QEvent::TabletTrackingChange);
        QCoreApplication::sendEvent(this, &e);
        break; }
    case Qt::WA_NativeWindow: {
        d->createTLExtra();
        if (on)
            d->createTLSysExtra();
#ifndef QT_NO_IM
        QWidget *focusWidget = d->effectiveFocusWidget();
        if (on && !internalWinId() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
        if (!QCoreApplication::testAttribute(Qt::AA_DontCreateNativeWidgetSiblings) && parentWidget())
            parentWidget()->d_func()->enforceNativeChildren();
        if (on && !internalWinId() && testAttribute(Qt::WA_WState_Created))
            d->createWinId();
        if (isEnabled() && focusWidget->isEnabled() && this == QGuiApplication::focusObject()
            && focusWidget->testAttribute(Qt::WA_InputMethodEnabled)) {
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_PaintOnScreen:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_OpaquePaintEvent:
        d->updateIsOpaque();
        break;
    case Qt::WA_NoSystemBackground:
        d->updateIsOpaque();
        Q_FALLTHROUGH();
    case Qt::WA_UpdatesDisabled:
        d->updateSystemBackground();
        break;
    case Qt::WA_TransparentForMouseEvents:
        break;
    case Qt::WA_InputMethodEnabled: {
#ifndef QT_NO_IM
        if (QGuiApplication::focusObject() == this) {
            if (!on)
                QGuiApplication::inputMethod()->commit();
            QGuiApplication::inputMethod()->update(Qt::ImEnabled);
        }
#endif //QT_NO_IM
        break;
    }
    case Qt::WA_WindowPropagation:
        d->resolvePalette();
        d->resolveFont();
        d->resolveLocale();
        break;
    case Qt::WA_DontShowOnScreen: {
        if (on && isVisible()) {
            // Make sure we keep the current state and only hide the widget
            // from the desktop. show_sys will only update platform specific
            // attributes at this point.
            d->hide_sys();
            d->show_sys();
        }
        break;
    }

    case Qt::WA_X11NetWmWindowTypeDesktop:
    case Qt::WA_X11NetWmWindowTypeDock:
    case Qt::WA_X11NetWmWindowTypeToolBar:
    case Qt::WA_X11NetWmWindowTypeMenu:
    case Qt::WA_X11NetWmWindowTypeUtility:
    case Qt::WA_X11NetWmWindowTypeSplash:
    case Qt::WA_X11NetWmWindowTypeDialog:
    case Qt::WA_X11NetWmWindowTypeDropDownMenu:
    case Qt::WA_X11NetWmWindowTypePopupMenu:
    case Qt::WA_X11NetWmWindowTypeToolTip:
    case Qt::WA_X11NetWmWindowTypeNotification:
    case Qt::WA_X11NetWmWindowTypeCombo:
    case Qt::WA_X11NetWmWindowTypeDND:
        d->setNetWmWindowTypes();
        break;

    case Qt::WA_StaticContents:
        if (QWidgetRepaintManager *repaintManager = d->maybeRepaintManager()) {
            if (on)
                repaintManager->addStaticWidget(this);
            else
                repaintManager->removeStaticWidget(this);
        }
        break;
    case Qt::WA_TranslucentBackground:
        if (on)
            setAttribute(Qt::WA_NoSystemBackground);
        d->updateIsTranslucent();

        break;
    case Qt::WA_AcceptTouchEvents:
        break;
    default:
        break;
    }
}